

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitroot.c
# Opt level: O0

void ur_pp(double *y,int N,char *alternative,char *type,int lshort,int *klag,double *statistic,
          double *pval)

{
  double dVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  reg_object obj;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_498;
  double dftable [48];
  double dftable_at [48];
  double prob [8];
  double nT [6];
  reg_object fit;
  long N3;
  double interp;
  double sum_yt1n;
  double sum_yt12;
  double sum_yt1;
  double tstat;
  double s2;
  double alpha;
  double dx;
  double trm4;
  double trm3;
  double trm2;
  double trm1;
  double nssqr_res;
  double at;
  double *tablep;
  double *table;
  double *res;
  double *varcovar;
  double *XX;
  double *tt;
  double *yt1;
  double *yt;
  double *z;
  int local_58;
  int iter;
  int tN;
  int pN;
  int l;
  int p;
  int N2;
  int N1;
  int j;
  int i;
  int *klag_local;
  char *pcStack_28;
  int lshort_local;
  char *type_local;
  char *alternative_local;
  double *pdStack_10;
  int N_local;
  double *y_local;
  
  _j = klag;
  klag_local._4_4_ = lshort;
  pcStack_28 = type;
  type_local = alternative;
  alternative_local._4_4_ = N;
  pdStack_10 = y;
  memset(prob + 7,0,0x30);
  prob[7] = 25.0;
  memcpy(dftable_at + 0x2f,&DAT_0017a1f0,0x40);
  memcpy(dftable + 0x2f,&DAT_0017a230,0x180);
  memcpy(&local_498,&DAT_0017a3b0,0x180);
  p = alternative_local._4_4_ + -1;
  l = p * p;
  lVar4 = (long)(l * p);
  iter = 8;
  local_58 = 6;
  yt = (double *)malloc((long)p << 4);
  XX = (double *)malloc((long)p << 3);
  varcovar = (double *)malloc((long)p << 4);
  table = (double *)malloc((long)p << 3);
  at = (double)malloc((long)iter << 3);
  for (N1 = 0; N1 < 2; N1 = N1 + 1) {
    for (N2 = 0; N2 < p; N2 = N2 + 1) {
      yt[N1 * p + N2] = pdStack_10[(N2 + 1) - N1];
    }
  }
  yt1 = yt;
  tt = yt + p;
  for (N1 = 1; N1 <= p; N1 = N1 + 1) {
    XX[N1 + -1] = (double)N1 - (double)p / 2.0;
  }
  pN = 3;
  res = (double *)malloc(0x48);
  memcpy(varcovar,XX,(long)p << 3);
  memcpy(varcovar + p,tt,(long)p << 3);
  nssqr_res = 0.95;
  obj = reg_init(p,pN);
  regress(obj,varcovar,yt1,table,res,nssqr_res);
  trm1 = 0.0;
  for (N1 = 0; N1 < p; N1 = N1 + 1) {
    trm1 = table[N1] * table[N1] + trm1;
  }
  dVar5 = trm1 / (double)p;
  trm1 = dVar5;
  if (klag_local._4_4_ == 1) {
    dVar6 = pow((double)p / 100.0,0.25);
    dVar6 = dVar6 * 4.0;
  }
  else {
    dVar6 = pow((double)p / 100.0,0.25);
    dVar6 = dVar6 * 12.0;
  }
  tN = (int)dVar6;
  if ((_j != (int *)0x0) && (0 < *_j)) {
    tN = *_j;
  }
  ppsum(table,p,tN,&trm1);
  interp = 0.0;
  sum_yt1n = 0.0;
  sum_yt12 = 0.0;
  for (N1 = 0; N1 < p; N1 = N1 + 1) {
    sum_yt12 = tt[N1] + sum_yt12;
    sum_yt1n = tt[N1] * tt[N1] + sum_yt1n;
    interp = tt[N1] * (double)(N1 + 1) + interp;
  }
  dVar6 = ((((double)(l * (l + -1)) * sum_yt1n) / 12.0 - (double)p * interp * interp) +
          (double)(p * (p + 1)) * interp * sum_yt12) -
          ((double)(p * (p + 1) * (p * 2 + 1)) * sum_yt12 * sum_yt12) / 6.0;
  iVar3 = strcmp(pcStack_28,"Z(alpha)");
  if (iVar3 == 0) {
    tablep = &local_498;
    *statistic = (double)p * (obj[1].sigma_upper - 1.0) +
                 -(((double)lVar4 / (dVar6 * 24.0)) * (double)lVar4 * (trm1 - dVar5));
  }
  else {
    iVar3 = strcmp(pcStack_28,"Z(t_alpha)");
    if (iVar3 != 0) {
      printf(" Type only admits two values : Z(alpha) and Z(t_alpha) \n");
      exit(-1);
    }
    tablep = dftable + 0x2f;
    dVar1 = obj[1].sigma_upper;
    dVar2 = obj[1].R2[0];
    dVar7 = sqrt(dVar5);
    dVar8 = sqrt(trm1);
    dVar9 = sqrt(3.0);
    dVar6 = sqrt(dVar6);
    dVar10 = sqrt(trm1);
    *statistic = (dVar7 / dVar8) * ((dVar1 - 1.0) / dVar2) +
                 -(((double)lVar4 / (dVar9 * 4.0 * dVar6 * dVar10)) * (trm1 - dVar5));
  }
  if (_j != (int *)0x0) {
    *_j = tN;
  }
  for (N1 = 0; N1 < iter; N1 = N1 + 1) {
    z._4_4_ = N1 * local_58;
    dVar5 = interpolate_linear(prob + 7,tablep + z._4_4_,local_58,(double)p);
    *(double *)((long)at + (long)N1 * 8) = dVar5;
  }
  dVar5 = interpolate_linear((double *)at,dftable_at + 0x2f,iter,*statistic);
  iVar3 = strcmp(type_local,"stationary");
  if (iVar3 == 0) {
    *pval = dVar5;
  }
  else {
    iVar3 = strcmp(type_local,"explosive");
    if (iVar3 != 0) {
      printf("alternative accepts only two values - stationary and explosive \n");
      exit(-1);
    }
    *pval = 1.0 - dVar5;
  }
  free_reg(obj);
  free(yt);
  free(XX);
  free(varcovar);
  free(res);
  free(table);
  free((void *)at);
  return;
}

Assistant:

void ur_pp(double *y, int N,const char* alternative,const char* type,int lshort, int *klag, double *statistic,double *pval) {
    /*
    y - Time Series data of length N
    alternative - "stationary" or "explosive"
    type - "Z(alpha)" or "Z(t_alpha)"
    lshort - determines the length of lag used. lshort = 1 => lag = 4.0 * pow(((double) N)/100.0,0.25)
    else lag = 12.0 * pow(((double) N)/100.0,0.25). It can be bypassed by parameter klag
    klag - Length of the lag. Set it to > 0 instead of NULL if you wnat it to bypass lshort. Set it to NULL or negative otherwise

    Outputs

    statistic - Test statistic
    pval - p-value used to determine null hypothesis

    */
    int i,j,N1,N2,p,l,pN,tN,iter;
    double *z,*yt,*yt1,*tt,*XX,*varcovar,*res,*table,*tablep;
    double at,nssqr_res,trm1,trm2,trm3,trm4,dx,alpha,s2,tstat;
    double sum_yt1,sum_yt12,sum_yt1n,interp;
    long int N3;
    reg_object fit;

    double nT[6] = {25, 50, 100, 250, 500, 100000};
    double prob[8] ={0.01, 0.025, 0.05, 0.10, 0.90, 0.95, 0.975, 0.99};
    double dftable_at[48] = {-4.38, -4.15, -4.04, -3.99, -3.98, -3.96,-3.95, -3.80, -3.73, -3.69, -3.68, -3.66,-3.60, -3.50, -3.45,
     -3.43, -3.42, -3.41,-3.24, -3.18, -3.15, -3.13, -3.13, -3.12,-1.14, -1.19, -1.22, -1.23, -1.24, -1.25,-0.80, -0.87, -0.90, -0.92,
      -0.93, -0.94,-0.50, -0.58, -0.62, -0.64, -0.65, -0.66,-0.15, -0.24, -0.28, -0.31, -0.32, -0.33};// 8X6

    double dftable[48] = {-22.5, -25.7, -27.4, -28.4, -28.9, -29.5, -19.9, -22.4, -23.6, -24.4, -24.8, -25.1, -17.9, -19.8, -20.7,
     -21.3, -21.5, -21.8, -15.6, -16.8, -17.5, -18.0, -18.1, -18.3, -3.66, -3.71, -3.74, -3.75, -3.76, -3.77, -2.51, -2.60, -2.62, 
     -2.64, -2.65, -2.66, -1.53, -1.66, -1.73, -1.78, -1.78, -1.79, -0.43, -0.65, -0.75, -0.82, -0.84, -0.87};// 8X6

    N1 = N - 1;
    N2 = N1 * N1;
    N3 = N2 * N1;

    pN = 8;
    tN = 6;

    z = (double*)malloc(sizeof(double)*2*N1);
    tt = (double*)malloc(sizeof(double)*N1);
    XX = (double*)malloc(sizeof(double)*2*N1);
    res = (double*)malloc(sizeof(double)*N1);
    tablep = (double*)malloc(sizeof(double)*pN);

    for(i = 0; i < 2;++i) {
        for(j = 0;j < N1;++j) {
            z[i*N1+j] = y[1+j-i];
        }
    } 

    yt = &z[0];
    yt1 = &z[N1];

    for(i = 1; i <= N1;++i) {
        tt[i-1] = (double)i - ((double)N1)/2.0;
    }

    p = 3;
    varcovar = (double*)malloc(sizeof(double)*p*p);

    memcpy(XX,tt,sizeof(double)*N1);
    memcpy(XX+N1,yt1,sizeof(double)*N1);

    at = 0.95;

    fit = reg_init(N1,p);

    //mdisplay(XX,2,N1);
    //mdisplay(yt,1,N1);

    regress(fit,XX,yt,res,varcovar,at);

    //summary(fit);
    //anova(fit);

    nssqr_res = 0.0;

    for(i =  0; i < N1;++i) {
        nssqr_res += (res[i]*res[i]);
    }

    nssqr_res /= ((double) N1);

    s2 = nssqr_res;

    if (lshort == 1) {
        l = (int) 4.0 * pow(((double) N1)/100.0,0.25);
    } else {
        l = (int) 12.0 * pow(((double) N1)/100.0,0.25);
    }

    if (klag != NULL && *klag > 0) {
        l = *klag;
    }

    ppsum(res,N1,l,&nssqr_res);

    sum_yt1 = sum_yt12 = sum_yt1n = 0.0;

    for(i = 0; i < N1;++i) {
        sum_yt1 += yt1[i];
        sum_yt12 += (yt1[i] * yt1[i]);
        sum_yt1n += (yt1[i] * (double) (i+1));
    }

    trm1 = N2 * (N2-1) *sum_yt12 / 12.0;
    trm2 = N1 * sum_yt1n * sum_yt1n;
    trm3 = N1 * (N1+1) * sum_yt1n * sum_yt1;
    trm4 = (N1 * (N1+1) * (2*N1+1) * sum_yt1 * sum_yt1) / 6.0;

    dx = trm1-trm2+trm3-trm4;

    //printf("dx %g \n",dx);    

    if (!strcmp(type,"Z(alpha)")) {
        table = &dftable[0];
        alpha = (fit->beta+2)->value;
        *statistic = (double) N1 * (alpha - 1.0) - ((double)N3 / (24.0 * dx)) * ((double)N3 * (nssqr_res - s2));
    } else if (!strcmp(type,"Z(t_alpha)")) {
        table = &dftable_at[0];
        tstat = ((fit->beta+2)->value - 1.0) / (fit->beta+2)->stdErr;
        *statistic = sqrt(s2)/sqrt(nssqr_res)*tstat - ((double) N3) / (4*sqrt(3.0)*sqrt(dx)*sqrt(nssqr_res))*(nssqr_res - s2);
    } else {
        printf(" Type only admits two values : Z(alpha) and Z(t_alpha) \n");
        exit(-1);
    }

    //printf("stat %g (fit->beta+2)->value %g \n",*statistic,(fit->beta+2)->value);

    //printf("\n ss1 %g ss2 %g \n",s2,nssqr_res);

    if (klag != NULL) *klag = l;

    
    for(i = 0; i < pN;++i) {
        iter = i * tN;
        tablep[i] = interpolate_linear(nT,table+iter,tN,(double)N1);
    }
    
    interp = interpolate_linear(tablep,prob,pN,*statistic);

    //printf("interp %g \n",interp);

    if (!strcmp(alternative,"stationary")) {
        *pval = interp;
    } else if (!strcmp(alternative,"explosive")) {
        *pval = 1.0 - interp;
    } else {
        printf("alternative accepts only two values - stationary and explosive \n");
        exit(-1);
    }

    

    free_reg(fit);
    free(z);
    free(tt);
    free(XX);
    free(varcovar);
    free(res);
    free(tablep);
}